

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O3

vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> * __thiscall
anon_unknown.dwarf_656d3::CliqueRunner::unpermute_and_finish
          (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
           *__return_storage_ptr__,CliqueRunner *this,vector<int,_std::allocator<int>_> *v)

{
  pointer ppVar1;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *pvVar2;
  vector<int,_std::allocator<int>_> *in_RCX;
  pointer ppVar3;
  pointer ppVar4;
  long lVar5;
  ulong uVar6;
  int *w;
  bool local_2e;
  bool local_2d;
  int local_2c;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (v != in_RCX) {
    do {
      local_2d = true;
      std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::emplace_back<int&,bool>
                ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)
                 __return_storage_ptr__,
                 (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 *(int *)&(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start,&local_2d);
      v = (vector<int,_std::allocator<int>_> *)
          ((long)&(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                  ._M_start + 4);
    } while (v != in_RCX);
  }
  local_2c = 0;
  pvVar2 = (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
           (ulong)(uint)this->size;
  if (0 < this->size) {
    do {
      ppVar1 = (__return_storage_ptr__->
               super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      ppVar4 = (__return_storage_ptr__->
               super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)ppVar1 - (long)ppVar4;
      if (0 < (long)uVar6 >> 5) {
        lVar5 = ((long)uVar6 >> 5) + 1;
        ppVar3 = (pointer)((long)&ppVar4->first + (uVar6 & 0xffffffffffffffe0));
        ppVar4 = ppVar4 + 2;
        do {
          if (ppVar4[-2].first == local_2c) {
            ppVar4 = ppVar4 + -2;
            goto LAB_0011590c;
          }
          if (ppVar4[-1].first == local_2c) {
            ppVar4 = ppVar4 + -1;
            goto LAB_0011590c;
          }
          if (ppVar4->first == local_2c) goto LAB_0011590c;
          if (ppVar4[1].first == local_2c) {
            ppVar4 = ppVar4 + 1;
            goto LAB_0011590c;
          }
          lVar5 = lVar5 + -1;
          ppVar4 = ppVar4 + 4;
        } while (1 < lVar5);
        uVar6 = (long)ppVar1 - (long)ppVar3;
        ppVar4 = ppVar3;
      }
      lVar5 = (long)uVar6 >> 3;
      if (lVar5 == 1) {
LAB_001158f1:
        if (ppVar4->first != local_2c) {
          ppVar4 = ppVar1;
        }
LAB_0011590c:
        if (ppVar1 == ppVar4) goto LAB_00115911;
      }
      else {
        if (lVar5 == 2) {
LAB_001158e9:
          if (ppVar4->first != local_2c) {
            ppVar4 = ppVar4 + 1;
            goto LAB_001158f1;
          }
          goto LAB_0011590c;
        }
        if (lVar5 == 3) {
          if (ppVar4->first != local_2c) {
            ppVar4 = ppVar4 + 1;
            goto LAB_001158e9;
          }
          goto LAB_0011590c;
        }
LAB_00115911:
        local_2e = false;
        std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::
        emplace_back<int&,bool>
                  ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)
                   __return_storage_ptr__,&local_2c,&local_2e);
        pvVar2 = (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                 (ulong)(uint)this->size;
      }
      local_2c = local_2c + 1;
    } while (local_2c < (int)pvVar2);
  }
  return pvVar2;
}

Assistant:

auto unpermute_and_finish(
            vector<int> & v) -> vector<pair<int, bool>>
        {
            vector<pair<int, bool>> result;
            for (auto & w : v)
                result.emplace_back(order[w], true);
            for (int w = 0; w < size; ++w)
                if (result.end() == find_if(result.begin(), result.end(), [&](auto & x) { return x.first == w; }))
                    result.emplace_back(w, false);
            return result;
        }